

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void cma_keygen(uint8_t *input,uint8_t *output)

{
  sha256_context ctx;
  aes_context aes;
  sha256_context local_1a0;
  aes_context local_138;
  
  sha256_init(&local_1a0);
  sha256_starts(&local_1a0);
  sha256_update(&local_1a0,input,8);
  sha256_update(&local_1a0,"Sri Jayewardenepura Kotte",0x19);
  sha256_final(&local_1a0,output);
  aes_init_dec(&local_138,cma_keygen::key,0x80);
  aes_ecb_decrypt(&local_138,output,output);
  aes_ecb_decrypt(&local_138,output + 0x10,output + 0x10);
  return;
}

Assistant:

void cma_keygen(const uint8_t *input, uint8_t output[32]) {
  static const uint8_t passphrase[] = "Sri Jayewardenepura Kotte";
  static const uint8_t key[] = {0xA9,0xFA,0x5A,0x62,0x79,0x9F,0xCC,0x4C,0x72,0x6B,0x4E,0x2C,0xE3,0x50,0x6D,0x38};
  sha256_context ctx;
  aes_context aes;
  sha256_init(&ctx);
  sha256_starts(&ctx);
  sha256_update(&ctx, input, 8);
  sha256_update(&ctx, passphrase, 25);
  sha256_final(&ctx, output);
  aes_init_dec(&aes, key, 128);
  aes_ecb_decrypt(&aes, output, output);
  aes_ecb_decrypt(&aes, output + 16, output + 16);
}